

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void processILibs(string *config,cmTarget *headTarget,cmLinkItem *item,
                 vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *tgts,
                 set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                 *emitted)

{
  bool bVar1;
  reference item_00;
  pair<std::_Rb_tree_const_iterator<const_cmTarget_*>,_bool> pVar2;
  byte local_69;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_68;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_60;
  const_iterator it;
  LinkInterfaceLibraries *iface;
  set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  *emitted_local;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *tgts_local;
  cmLinkItem *item_local;
  cmTarget *headTarget_local;
  string *config_local;
  
  local_69 = 0;
  if (item->Target != (cmTarget *)0x0) {
    pVar2 = std::
            set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::
            insert(emitted,&item->Target);
    local_69 = pVar2.second;
  }
  if ((local_69 & 1) != 0) {
    std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::push_back(tgts,&item->Target);
    it._M_current =
         (cmLinkItem *)cmTarget::GetLinkInterfaceLibraries(item->Target,config,headTarget,true);
    if (it._M_current != (cmLinkItem *)0x0) {
      local_60._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)it._M_current);
      while( true ) {
        local_68._M_current =
             (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(it._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
        if (!bVar1) break;
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&local_60);
        processILibs(config,headTarget,item_00,tgts,emitted);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_60);
      }
    }
  }
  return;
}

Assistant:

void processILibs(const std::string& config,
                  cmTarget const* headTarget,
                  cmLinkItem const& item,
                  std::vector<cmTarget const*>& tgts,
                  std::set<cmTarget const*>& emitted)
{
  if (item.Target && emitted.insert(item.Target).second)
    {
    tgts.push_back(item.Target);
    if(cmTarget::LinkInterfaceLibraries const* iface =
       item.Target->GetLinkInterfaceLibraries(config, headTarget, true))
      {
      for(std::vector<cmLinkItem>::const_iterator
            it = iface->Libraries.begin();
          it != iface->Libraries.end(); ++it)
        {
        processILibs(config, headTarget, *it, tgts, emitted);
        }
      }
    }
}